

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall ieee754::get_mbit(ieee754 *this,int n)

{
  int iVar1;
  
  iVar1 = n + this->ebits + 1;
  return (uint)((this->buf[this->bytes + iVar1 / -8 + -1] &
                (byte)(1 << (7U - (char)(iVar1 % 8) & 0x1f))) != 0);
}

Assistant:

inline void get_mbit_ptr(int &byteidx, unsigned char &mask, int n) const
    {
        /* figure the raw bit vector index, past the sign and exponent bits */
        n += 1 + ebits;

        /* get the byte index (little-endian order) */
        byteidx = bytes - 1 - n/8;

        /* get the bit index within the byte, and the corresponding bit mask */
        n = 7 - (n % 8);
        mask = 1 << n;
    }